

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O3

fdb_status docio_read_doc_length(docio_handle *handle,docio_length *length,uint64_t offset)

{
  err_log_callback *log_callback;
  uint uVar1;
  undefined8 uVar2;
  docio_length dVar3;
  byte bVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  ushort uVar7;
  uint32_t uVar8;
  int64_t iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  fdb_status fVar13;
  undefined1 auVar14 [16];
  docio_length _length;
  docio_length local_40;
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  iVar9 = _docio_read_length(handle,offset,&_length,log_callback,true);
  dVar3 = _length;
  if (iVar9 < 0) {
    fVar13 = (fdb_status)iVar9;
  }
  else {
    bVar4 = _length.bodylen._3_1_;
    uVar6 = _length.checksum;
    auVar14[0] = -((char)_length.keylen == '\0');
    auVar14[1] = -(_length.keylen._1_1_ == '\0');
    auVar14[2] = -((char)_length.metalen == '\0');
    auVar14[3] = -(_length.metalen._1_1_ == '\0');
    auVar14[4] = -((char)_length.bodylen == '\0');
    auVar14[5] = -(_length.bodylen._1_1_ == '\0');
    auVar14[6] = -(_length.bodylen._2_1_ == '\0');
    auVar14[7] = -(_length.bodylen._3_1_ == 0);
    auVar14[8] = -((char)_length.bodylen_ondisk == '\0');
    auVar14[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
    auVar14[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
    auVar14[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
    auVar14[0xc] = -(_length.flag == '\0');
    auVar14[0xd] = -(_length.checksum == '\0');
    auVar14[0xe] = -((char)_length.reserved == '\0');
    auVar14[0xf] = -(_length.reserved._1_1_ == '\0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) == 0xffff) {
      length->keylen = 0;
      length->metalen = 0;
      length->bodylen = 0;
      length->bodylen_ondisk = 0;
      length->flag = '\0';
      length->checksum = '\0';
      length->reserved = 0;
      fVar13 = FDB_RESULT_SUCCESS;
    }
    else {
      uVar2 = _length._0_8_;
      uVar5 = _length._8_8_;
      local_40.keylen = _length.keylen;
      local_40.metalen = _length.metalen;
      local_40.bodylen = _length.bodylen;
      local_40.bodylen_ondisk = _length.bodylen_ondisk;
      local_40.flag = _length.flag;
      local_40.checksum = _length.checksum;
      local_40.reserved = _length.reserved;
      _length = dVar3;
      uVar8 = get_checksum((uint8_t *)&local_40,0xc,handle->file->crc_mode);
      if (uVar6 == (uint8_t)uVar8) {
        uVar7 = dVar3.keylen << 8 | dVar3.keylen >> 8;
        uVar1 = dVar3.bodylen;
        uVar12 = dVar3.bodylen_ondisk;
        uVar11 = uVar5 & 0xffffffff00000000 |
                 (ulong)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18);
        uVar10 = (ulong)uVar7 |
                 CONCAT44(uVar1 << 0x18 | (uint)bVar4 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8,
                          (dVar3._1_4_ & 0xff00 | dVar3._3_4_ & 0xff) << 0x10);
        length->keylen = (short)uVar10;
        length->metalen = (short)(uVar10 >> 0x10);
        length->bodylen = (int)(uVar10 >> 0x20);
        length->bodylen_ondisk = (int)uVar11;
        length->flag = (char)(uVar11 >> 0x20);
        length->checksum = (char)(uVar11 >> 0x28);
        length->reserved = (short)(uVar11 >> 0x30);
        fVar13 = FDB_RESULT_SUCCESS;
        if ((ushort)(uVar7 + 0xf) < 0x10) {
          fVar13 = FDB_RESULT_FILE_CORRUPTION;
          fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_length",0x3f8,
                       "Error in decoding the doc length metadata in file %s crc %x keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                       ,handle->file->filename,(ulong)(uVar8 & 0xff),(ulong)(dVar3._0_4_ & 0xffff),
                       (ulong)(dVar3._2_4_ & 0xffff),(ulong)uVar2 >> 0x20,uVar5,offset);
        }
      }
      else {
        fVar13 = FDB_RESULT_CHECKSUM_ERROR;
        fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_length",0x3ed,
                     "doc_length checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,handle->file->filename,(ulong)(uVar8 & 0xff),(ulong)uVar5 >> 0x28 & 0xff,
                     (ulong)(dVar3._0_4_ & 0xffff),(ulong)(dVar3._2_4_ & 0xffff),
                     (ulong)uVar2 >> 0x20,uVar5,offset);
      }
    }
  }
  return fVar13;
}

Assistant:

fdb_status docio_read_doc_length(struct docio_handle *handle,
                                 struct docio_length *length,
                                 uint64_t offset)
{
    uint8_t checksum;
    int64_t _offset;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback, true);
    if (_offset < 0) {
        return (fdb_status) _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        *length = zero_length;
        return FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_CHECKSUM_ERROR;
    }

    *length = _docio_length_decode(_length);
    if (length->keylen == 0 || length->keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata in file %s"
                " crc %x keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_FILE_CORRUPTION;
    }

    return FDB_RESULT_SUCCESS;
}